

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshifter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1565df::PshifterState::process
          (PshifterState *this,size_t samplesToDo,
          span<const_std::array<float,_1024UL>,_18446744073709551615UL> samplesIn,
          span<std::array<float,_1024UL>,_18446744073709551615UL> samplesOut)

{
  span<std::complex<double>,_18446744073709551615UL> buffer;
  span<std::complex<double>,_18446744073709551615UL> buffer_00;
  span<std::array<float,_1024UL>,_18446744073709551615UL> sVar1;
  value_type_conflict5 vVar2;
  iterator pvVar3;
  iterator pvVar4;
  iterator pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  pointer ptr;
  float *pfVar11;
  size_t sVar12;
  float *pfVar13;
  ulong in_RSI;
  long in_RDI;
  pointer in_R8;
  pointer in_R9;
  double dVar14;
  double dVar15;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar16 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar17 [16];
  double *accum_iter;
  size_t k_5;
  size_t k_4;
  size_t k_3;
  size_t j;
  size_t k_2;
  size_t bin_count;
  int qpd;
  double tmp;
  double phase;
  double amplitude;
  size_t k_1;
  size_t k;
  iterator fifo_iter;
  size_t todo;
  size_t base;
  double expected_cycles;
  FrequencyBin *in_stack_fffffffffffffdb8;
  FrequencyBin *in_stack_fffffffffffffdc0;
  array<std::complex<double>,_1024UL> *in_stack_fffffffffffffdc8;
  span<std::complex<double>,_18446744073709551615UL> *in_stack_fffffffffffffdd0;
  double *in_stack_fffffffffffffdd8;
  MixerFunc p_Var18;
  iterator in_stack_fffffffffffffde0;
  iterator in_stack_fffffffffffffde8;
  span<const_float,_18446744073709551615UL> local_128;
  undefined8 local_118;
  double *local_110;
  ulong local_108;
  undefined8 local_f0;
  undefined8 local_e8;
  ulong local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  int local_94;
  double local_90;
  value_type_conflict5 local_88;
  double local_80;
  ulong local_78;
  ulong local_60;
  iterator local_50;
  size_t local_48;
  ulong local_40;
  undefined8 local_38;
  ulong local_30;
  pointer local_20;
  pointer local_18;
  span<const_std::array<float,_1024UL>,_18446744073709551615UL> local_10;
  
  local_38 = 0x3ff921fb54442d18;
  local_40 = 0;
  local_30 = in_RSI;
  local_20 = in_R8;
  local_18 = in_R9;
  while (local_40 < local_30) {
    local_48 = minz(0x400 - *(long *)(in_RDI + 0x20),local_30 - local_40);
    pvVar3 = std::array<double,_1024UL>::begin((array<double,_1024UL> *)0x1ddf09);
    pvVar3 = pvVar3 + *(long *)(in_RDI + 0x20);
    pvVar4 = pvVar3 + local_48;
    local_50 = pvVar3;
    pvVar5 = std::array<float,_1024UL>::begin((array<float,_1024UL> *)0x1ddf5f);
    std::
    transform<double*,float*,(anonymous_namespace)::PshifterState::process(unsigned_long,al::span<std::array<float,1024ul>const,18446744073709551615ul>,al::span<std::array<float,1024ul>,18446744073709551615ul>)::__0>
              (pvVar3,pvVar4,pvVar5 + local_40);
    al::span<const_std::array<float,_1024UL>,_18446744073709551615UL>::operator[](&local_10,0);
    std::array<float,_1024UL>::begin((array<float,_1024UL> *)0x1ddf9f);
    std::copy_n<float_const*,unsigned_long,double*>
              ((float *)in_stack_fffffffffffffde8,(unsigned_long)in_stack_fffffffffffffde0,
               in_stack_fffffffffffffdd8);
    *(size_t *)(in_RDI + 0x20) = local_48 + *(long *)(in_RDI + 0x20);
    local_40 = local_48 + local_40;
    if (*(ulong *)(in_RDI + 0x20) < 0x400) break;
    *(undefined8 *)(in_RDI + 0x20) = 0x300;
    for (local_60 = 0; local_60 < 0x400; local_60 = local_60 + 1) {
      pvVar6 = std::array<double,_1024UL>::operator[]
                         ((array<double,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      dVar14 = *pvVar6;
      pvVar7 = std::array<double,_1024UL>::operator[]
                         ((array<double,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      dVar15 = *pvVar7;
      pvVar8 = std::array<std::complex<double>,_1024UL>::operator[]
                         ((array<std::complex<double>,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      std::complex<double>::operator=(pvVar8,dVar14 * dVar15);
    }
    al::span<std::complex<double>,18446744073709551615ul>::span<1024ul>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    buffer.mDataEnd = (pointer)in_stack_fffffffffffffdd0;
    buffer.mData = in_stack_fffffffffffffdc8->_M_elems;
    forward_fft(buffer);
    for (local_78 = 0; local_78 < 0x201; local_78 = local_78 + 1) {
      std::array<std::complex<double>,_1024UL>::operator[]
                ((array<std::complex<double>,_1024UL> *)in_stack_fffffffffffffdc0,
                 (size_type)in_stack_fffffffffffffdb8);
      local_80 = std::abs<double>((complex<double> *)in_stack_fffffffffffffdc0);
      std::array<std::complex<double>,_1024UL>::operator[]
                ((array<std::complex<double>,_1024UL> *)in_stack_fffffffffffffdc0,
                 (size_type)in_stack_fffffffffffffdb8);
      dVar14 = std::arg<double>((complex<double> *)in_stack_fffffffffffffdc0);
      local_88 = dVar14;
      pvVar9 = std::array<double,_513UL>::operator[]
                         ((array<double,_513UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      auVar17._8_4_ = (int)(local_78 >> 0x20);
      auVar17._0_8_ = local_78;
      auVar17._12_4_ = 0x45300000;
      dVar14 = (dVar14 - *pvVar9) -
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)) *
               1.5707963267948966;
      local_90 = dVar14;
      dVar15 = al::MathDefs<double>::Pi();
      local_94 = double2int(dVar14 / dVar15);
      dVar15 = al::MathDefs<double>::Pi();
      dVar14 = local_80;
      local_90 = (local_90 - dVar15 * (double)(local_94 + local_94 % 2)) / 1.5707963267948966;
      pvVar10 = std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                          ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)
                           in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      pvVar10->Amplitude = dVar14;
      auVar16._8_4_ = (int)(local_78 >> 0x20);
      auVar16._0_8_ = local_78;
      auVar16._12_4_ = 0x45300000;
      dVar14 = (double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0;
      dVar15 = auVar16._8_8_ - 1.9342813113834067e+25;
      in_XMM1._8_4_ = SUB84(dVar15,0);
      in_XMM1._0_8_ = dVar14;
      in_XMM1._12_4_ = (int)((ulong)dVar15 >> 0x20);
      dVar14 = dVar15 + dVar14 + local_90;
      pvVar10 = std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                          ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)
                           in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      vVar2 = local_88;
      pvVar10->FreqBin = dVar14;
      pvVar9 = std::array<double,_513UL>::operator[]
                         ((array<double,_513UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      *pvVar9 = vVar2;
    }
    std::array<(anonymous_namespace)::FrequencyBin,_513UL>::begin
              ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)0x1de3ab);
    std::array<(anonymous_namespace)::FrequencyBin,_513UL>::end
              ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)0x1de3c7);
    local_a8 = 0;
    local_a0 = 0;
    std::fill<(anonymous_namespace)::FrequencyBin*,(anonymous_namespace)::FrequencyBin>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(FrequencyBin *)0x1de3f7);
    local_b0 = minz(0x201,(ulong)((int)(0x2007ff / (ulong)*(uint *)(in_RDI + 0x28)) + 1));
    for (local_b8 = 0; local_b8 < local_b0; local_b8 = local_b8 + 1) {
      local_c0 = local_b8 * *(uint *)(in_RDI + 0x28) + 0x800 >> 0xc;
      pvVar10 = std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                          ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)
                           in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      dVar14 = pvVar10->Amplitude;
      pvVar10 = std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                          ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)
                           in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      pvVar10->Amplitude = dVar14 + pvVar10->Amplitude;
      pvVar10 = std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                          ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)
                           in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      dVar14 = pvVar10->FreqBin;
      dVar15 = *(double *)(in_RDI + 0x30);
      pvVar10 = std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                          ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)
                           in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      pvVar10->FreqBin = dVar14 * dVar15;
    }
    for (local_c8 = 0; local_c8 < 0x201; local_c8 = local_c8 + 1) {
      pvVar10 = std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                          ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)
                           in_stack_fffffffffffffdc0,(size_type)in_stack_fffffffffffffdb8);
      dVar14 = pvVar10->FreqBin;
      pvVar9 = std::array<double,_513UL>::operator[]
                         ((array<double,_513UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      in_XMM1._8_8_ = 0;
      in_XMM1._0_8_ = *pvVar9;
      *pvVar9 = dVar14 * 1.5707963267948966 + *pvVar9;
      std::array<(anonymous_namespace)::FrequencyBin,_513UL>::operator[]
                ((array<(anonymous_namespace)::FrequencyBin,_513UL> *)in_stack_fffffffffffffdc0,
                 (size_type)in_stack_fffffffffffffdb8);
      std::array<double,_513UL>::operator[]
                ((array<double,_513UL> *)in_stack_fffffffffffffdc0,
                 (size_type)in_stack_fffffffffffffdb8);
      std::polar<double>((double *)in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8);
      local_d0 = in_XMM1._0_8_;
      local_d8 = extraout_XMM0_Qa;
      pvVar8 = std::array<std::complex<double>,_1024UL>::operator[]
                         ((array<std::complex<double>,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      *(undefined8 *)pvVar8->_M_value = local_d8;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_d0;
    }
    for (local_e0 = 0x201; local_e0 < 0x400; local_e0 = local_e0 + 1) {
      std::array<std::complex<double>,_1024UL>::operator[]
                ((array<std::complex<double>,_1024UL> *)in_stack_fffffffffffffdc0,
                 (size_type)in_stack_fffffffffffffdb8);
      std::conj<double>((complex<double> *)in_stack_fffffffffffffdc0);
      local_e8 = in_XMM1._0_8_;
      local_f0 = extraout_XMM0_Qa_00;
      pvVar8 = std::array<std::complex<double>,_1024UL>::operator[]
                         ((array<std::complex<double>,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      *(undefined8 *)pvVar8->_M_value = local_f0;
      *(undefined8 *)(pvVar8->_M_value + 8) = local_e8;
    }
    al::span<std::complex<double>,18446744073709551615ul>::span<1024ul>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    buffer_00.mDataEnd = (pointer)in_stack_fffffffffffffdd0;
    buffer_00.mData = in_stack_fffffffffffffdc8->_M_elems;
    inverse_fft(buffer_00);
    for (local_108 = 0; local_108 < 0x400; local_108 = local_108 + 1) {
      pvVar7 = std::array<double,_1024UL>::operator[]
                         ((array<double,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      dVar14 = *pvVar7;
      pvVar8 = std::array<std::complex<double>,_1024UL>::operator[]
                         ((array<std::complex<double>,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      dVar15 = std::complex<double>::real_abi_cxx11_(pvVar8);
      pvVar6 = std::array<double,_1024UL>::operator[]
                         ((array<double,_1024UL> *)in_stack_fffffffffffffdc0,
                          (size_type)in_stack_fffffffffffffdb8);
      in_XMM1._8_8_ = 0;
      in_XMM1._0_8_ = *pvVar6;
      *pvVar6 = dVar14 * dVar15 * 0.0009765625 + *pvVar6;
    }
    in_stack_fffffffffffffde0 = std::array<double,_1024UL>::begin((array<double,_1024UL> *)0x1de7f5)
    ;
    in_stack_fffffffffffffde0 = in_stack_fffffffffffffde0 + 0x100;
    in_stack_fffffffffffffde8 = std::array<double,_1024UL>::end((array<double,_1024UL> *)0x1de811);
    std::array<double,_1024UL>::begin((array<double,_1024UL> *)0x1de827);
    local_50 = std::copy<double*,double*>
                         ((double *)in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8,
                          &in_stack_fffffffffffffdc0->Amplitude);
    std::array<double,_1024UL>::begin((array<double,_1024UL> *)0x1de855);
    std::copy_n<double*,int,double*>
              (in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
               in_stack_fffffffffffffdd8);
    std::array<double,_1024UL>::begin((array<double,_1024UL> *)0x1de87e);
    std::array<double,_1024UL>::end((array<double,_1024UL> *)0x1de89d);
    std::array<double,_1024UL>::begin((array<double,_1024UL> *)0x1de8b6);
    local_110 = std::copy<double*,double*>
                          ((double *)in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8,
                           &in_stack_fffffffffffffdc0->Amplitude);
    std::array<double,_1024UL>::end((array<double,_1024UL> *)0x1de8f1);
    local_118 = 0;
    std::fill<double*,double>
              (&in_stack_fffffffffffffdc0->Amplitude,&in_stack_fffffffffffffdb8->Amplitude,
               (double *)0x1de912);
  }
  p_Var18 = MixSamples;
  ptr = std::array<float,_1024UL>::data((array<float,_1024UL> *)0x1de93a);
  al::span<const_float,_18446744073709551615UL>::span(&local_128,ptr,local_30);
  pfVar13 = (float *)(in_RDI + 0xf070);
  pfVar11 = (float *)(in_RDI + 0xf0b0);
  sVar12 = maxz(local_30,0x200);
  sVar1.mDataEnd = local_18;
  sVar1.mData = local_20;
  (*p_Var18)(local_128,sVar1,pfVar13,pfVar11,sVar12,0);
  return;
}

Assistant:

void PshifterState::process(const size_t samplesToDo, const al::span<const FloatBufferLine> samplesIn, const al::span<FloatBufferLine> samplesOut)
{
    /* Pitch shifter engine based on the work of Stephan Bernsee.
     * http://blogs.zynaptiq.com/bernsee/pitch-shifting-using-the-ft/
     */

    /* Cycle offset per update expected of each frequency bin (bin 0 is none,
     * bin 1 is x1, bin 2 is x2, etc).
     */
    constexpr double expected_cycles{al::MathDefs<double>::Tau() / OVERSAMP};

    for(size_t base{0u};base < samplesToDo;)
    {
        const size_t todo{minz(STFT_SIZE-mCount, samplesToDo-base)};

        /* Retrieve the output samples from the FIFO and fill in the new input
         * samples.
         */
        auto fifo_iter = mFIFO.begin() + mCount;
        std::transform(fifo_iter, fifo_iter+todo, mBufferOut.begin()+base,
            [](double d) noexcept -> float { return static_cast<float>(d); });

        std::copy_n(samplesIn[0].begin()+base, todo, fifo_iter);
        mCount += todo;
        base += todo;

        /* Check whether FIFO buffer is filled with new samples. */
        if(mCount < STFT_SIZE) break;
        mCount = FIFO_LATENCY;

        /* Time-domain signal windowing, store in FftBuffer, and apply a
         * forward FFT to get the frequency-domain signal.
         */
        for(size_t k{0u};k < STFT_SIZE;k++)
            mFftBuffer[k] = mFIFO[k] * HannWindow[k];
        forward_fft(mFftBuffer);

        /* Analyze the obtained data. Since the real FFT is symmetric, only
         * STFT_HALF_SIZE+1 samples are needed.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            const double amplitude{std::abs(mFftBuffer[k])};
            const double phase{std::arg(mFftBuffer[k])};

            /* Compute phase difference and subtract expected phase difference */
            double tmp{(phase - mLastPhase[k]) - static_cast<double>(k)*expected_cycles};

            /* Map delta phase into +/- Pi interval */
            int qpd{double2int(tmp / al::MathDefs<double>::Pi())};
            tmp -= al::MathDefs<double>::Pi() * (qpd + (qpd%2));

            /* Get deviation from bin frequency from the +/- Pi interval */
            tmp /= expected_cycles;

            /* Compute the k-th partials' true frequency and store the
             * amplitude and frequency bin in the analysis buffer.
             */
            mAnalysisBuffer[k].Amplitude = amplitude;
            mAnalysisBuffer[k].FreqBin = static_cast<double>(k) + tmp;

            /* Store the actual phase[k] for the next frame. */
            mLastPhase[k] = phase;
        }

        /* Shift the frequency bins according to the pitch adjustment,
         * accumulating the amplitudes of overlapping frequency bins.
         */
        std::fill(mSynthesisBuffer.begin(), mSynthesisBuffer.end(), FrequencyBin{});
        const size_t bin_count{minz(STFT_HALF_SIZE+1,
            (((STFT_HALF_SIZE+1)<<MixerFracBits) - (MixerFracOne>>1) - 1)/mPitchShiftI + 1)};
        for(size_t k{0u};k < bin_count;k++)
        {
            const size_t j{(k*mPitchShiftI + (MixerFracOne>>1)) >> MixerFracBits};
            mSynthesisBuffer[j].Amplitude += mAnalysisBuffer[k].Amplitude;
            mSynthesisBuffer[j].FreqBin    = mAnalysisBuffer[k].FreqBin * mPitchShift;
        }

        /* Reconstruct the frequency-domain signal from the adjusted frequency
         * bins.
         */
        for(size_t k{0u};k < STFT_HALF_SIZE+1;k++)
        {
            /* Calculate actual delta phase and accumulate it to get bin phase */
            mSumPhase[k] += mSynthesisBuffer[k].FreqBin * expected_cycles;

            mFftBuffer[k] = std::polar(mSynthesisBuffer[k].Amplitude, mSumPhase[k]);
        }
        for(size_t k{STFT_HALF_SIZE+1};k < STFT_SIZE;++k)
            mFftBuffer[k] = std::conj(mFftBuffer[STFT_SIZE-k]);

        /* Apply an inverse FFT to get the time-domain siganl, and accumulate
         * for the output with windowing.
         */
        inverse_fft(mFftBuffer);
        for(size_t k{0u};k < STFT_SIZE;k++)
            mOutputAccum[k] += HannWindow[k]*mFftBuffer[k].real() * (4.0/OVERSAMP/STFT_SIZE);

        /* Shift FIFO and accumulator. */
        fifo_iter = std::copy(mFIFO.begin()+STFT_STEP, mFIFO.end(), mFIFO.begin());
        std::copy_n(mOutputAccum.begin(), STFT_STEP, fifo_iter);
        auto accum_iter = std::copy(mOutputAccum.begin()+STFT_STEP, mOutputAccum.end(),
            mOutputAccum.begin());
        std::fill(accum_iter, mOutputAccum.end(), 0.0);
    }

    /* Now, mix the processed sound data to the output. */
    MixSamples({mBufferOut.data(), samplesToDo}, samplesOut, mCurrentGains, mTargetGains,
        maxz(samplesToDo, 512), 0);
}